

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O2

void time_sleep(double seconds)

{
  int iVar1;
  timespec rem;
  timespec ts;
  timespec local_30;
  timespec local_20;
  
  if (0.0 < seconds) {
    local_20.tv_sec = (__time_t)seconds;
    local_20.tv_nsec = (long)((seconds - (double)local_20.tv_sec) * 1000000000.0);
    while (iVar1 = clock_nanosleep(0,0,&local_20,&local_30), iVar1 != 0) {
      local_20.tv_sec = local_30.tv_sec;
      local_20.tv_nsec = local_30.tv_nsec;
    }
  }
  return;
}

Assistant:

void time_sleep(double seconds)
{
   struct timespec ts, rem;

   if (seconds > 0.0)
   {
      ts.tv_sec = seconds;
      ts.tv_nsec = (seconds-(double)ts.tv_sec) * 1E9;

      while (clock_nanosleep(CLOCK_REALTIME, 0, &ts, &rem))
      {
         /* copy remaining time to ts */
         ts.tv_sec  = rem.tv_sec;
         ts.tv_nsec = rem.tv_nsec;
      }
   }
}